

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O2

int mbedtls_x509write_crt_set_basic_constraints
              (mbedtls_x509write_cert *ctx,int is_ca,int max_pathlen)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  uchar *c;
  uchar buf [9];
  uchar local_27 [7];
  
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  uVar1 = 0xffffd800;
  if (is_ca == 0 || max_pathlen < 0x80) {
    c = local_27;
    if (is_ca == 0) {
      sVar4 = 0;
    }
    else {
      if (max_pathlen < 0) {
        uVar3 = 0;
      }
      else {
        uVar1 = mbedtls_asn1_write_int(&c,buf,max_pathlen);
        if ((int)uVar1 < 0) {
          return uVar1;
        }
        uVar3 = (ulong)uVar1;
      }
      uVar1 = mbedtls_asn1_write_bool(&c,buf,1);
      if ((int)uVar1 < 0) {
        return uVar1;
      }
      sVar4 = uVar3 + uVar1;
    }
    uVar2 = mbedtls_asn1_write_len(&c,buf,sVar4);
    uVar1 = uVar2;
    if ((-1 < (int)uVar2) && (uVar1 = mbedtls_asn1_write_tag(&c,buf,'0'), -1 < (int)uVar1)) {
      sVar4 = (ulong)uVar1 + sVar4 + uVar2;
      uVar1 = mbedtls_x509_set_extension(&ctx->extensions,"U\x1d\x13",3,0,local_27 + -sVar4,sVar4);
    }
  }
  return uVar1;
}

Assistant:

int mbedtls_x509write_crt_set_basic_constraints( mbedtls_x509write_cert *ctx,
                                         int is_ca, int max_pathlen )
{
    int ret;
    unsigned char buf[9];
    unsigned char *c = buf + sizeof(buf);
    size_t len = 0;

    memset( buf, 0, sizeof(buf) );

    if( is_ca && max_pathlen > 127 )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    if( is_ca )
    {
        if( max_pathlen >= 0 )
        {
            MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, max_pathlen ) );
        }
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_bool( &c, buf, 1 ) );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_BASIC_CONSTRAINTS,
                                        MBEDTLS_OID_SIZE( MBEDTLS_OID_BASIC_CONSTRAINTS ),
                                        0, buf + sizeof(buf) - len, len );
}